

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_find(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_INT *found)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  ulong uVar3;
  REF_INT RVar4;
  
  *found = -1;
  uVar3 = 0xffffffff;
  if (-1 < node) {
    uVar3 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar3 != -1) {
    RVar4 = ref_geom->ref_adj->item[(int)uVar3].ref;
    do {
      if ((ref_geom->descr[RVar4 * 6] == type) && (ref_geom->descr[(int)(RVar4 * 6 | 1)] == id)) {
        *found = RVar4;
        return 0;
      }
      pRVar2 = ref_geom->ref_adj->item;
      iVar1 = pRVar2[(int)uVar3].next;
      uVar3 = (ulong)iVar1;
      if (uVar3 == 0xffffffffffffffff) {
        RVar4 = -1;
      }
      else {
        RVar4 = pRVar2[uVar3].ref;
      }
    } while (iVar1 != -1);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_find(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_INT id, REF_INT *found) {
  REF_INT item, geom;
  *found = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom) &&
        id == ref_geom_id(ref_geom, geom)) {
      *found = geom;
      return REF_SUCCESS;
    }
  }
  return REF_NOT_FOUND;
}